

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O0

ktx_error_code_e ktxMemStream_skip(ktxStream *str,ktx_size_t count)

{
  FILE *pFVar1;
  char *pcVar2;
  ktx_off_t newpos;
  ktxMem *mem;
  ktx_size_t count_local;
  ktxStream *str_local;
  ktx_error_code_e local_4;
  
  if ((str == (ktxStream *)0x0) || (pFVar1 = (str->data).file, pFVar1 == (FILE *)0x0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    pcVar2 = pFVar1->_IO_write_base + count;
    if (((long)pcVar2 < (long)pFVar1->_IO_write_base) || (pFVar1->_IO_read_base < pcVar2)) {
      local_4 = KTX_FILE_UNEXPECTED_EOF;
    }
    else {
      pFVar1->_IO_write_base = pcVar2;
      local_4 = KTX_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

static
KTX_error_code ktxMemStream_skip(ktxStream* str, const ktx_size_t count)
{
    ktxMem* mem;
    ktx_off_t newpos;

    if (!str || (mem = str->data.mem) == 0)
        return KTX_INVALID_VALUE;

    newpos = mem->pos + count;
    /* The first clause checks for overflow. */
    if (newpos < mem->pos || (ktx_size_t)newpos > mem->used_size)
        return KTX_FILE_UNEXPECTED_EOF;

    mem->pos = newpos;

    return KTX_SUCCESS;
}